

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidget::setRangeSelected(QTableWidget *this,QTableWidgetSelectionRange *range,bool select)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  QAbstractItemModel *pQVar6;
  QItemSelectionModel *pQVar7;
  QTableWidgetSelectionRange *in_RSI;
  long in_FS_OFFSET;
  QModelIndex bottomRight;
  QModelIndex topLeft;
  SelectionFlag in_stack_fffffffffffffedc;
  QAbstractItemView *in_stack_fffffffffffffee0;
  QAbstractItemView *in_stack_fffffffffffffef0;
  byte local_ca;
  undefined4 local_b4;
  QItemSelection local_b0;
  undefined1 local_98 [24];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QAbstractItemView::model(in_stack_fffffffffffffef0);
  iVar2 = QTableWidgetSelectionRange::topRow(in_RSI);
  uVar3 = QTableWidgetSelectionRange::leftColumn(in_RSI);
  QAbstractItemView::rootIndex(in_stack_fffffffffffffee0);
  bVar1 = QAbstractItemModel::hasIndex((int)pQVar5,iVar2,(QModelIndex *)(ulong)uVar3);
  local_ca = 1;
  if ((bVar1 & 1) != 0) {
    pQVar5 = QAbstractItemView::model(in_stack_fffffffffffffef0);
    iVar2 = QTableWidgetSelectionRange::bottomRow(in_RSI);
    uVar3 = QTableWidgetSelectionRange::rightColumn(in_RSI);
    QAbstractItemView::rootIndex(in_stack_fffffffffffffee0);
    local_ca = QAbstractItemModel::hasIndex((int)pQVar5,iVar2,(QModelIndex *)(ulong)uVar3);
    local_ca = local_ca ^ 0xff;
  }
  if ((local_ca & 1) == 0) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QAbstractItemView::model(in_stack_fffffffffffffef0);
    iVar2 = QTableWidgetSelectionRange::topRow(in_RSI);
    iVar4 = QTableWidgetSelectionRange::leftColumn(in_RSI);
    QAbstractItemView::rootIndex((QAbstractItemView *)pQVar5);
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_50,pQVar5,iVar2,iVar4,local_68);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QAbstractItemView::model(in_stack_fffffffffffffef0);
    iVar2 = QTableWidgetSelectionRange::bottomRow(in_RSI);
    iVar4 = QTableWidgetSelectionRange::rightColumn(in_RSI);
    QAbstractItemView::rootIndex((QAbstractItemView *)pQVar5);
    (**(code **)(*(long *)pQVar6 + 0x60))(&local_80,pQVar6,iVar2,iVar4,local_98);
    pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar5);
    QItemSelection::QItemSelection(&local_b0,(QModelIndex *)&local_50,(QModelIndex *)&local_80);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar5,in_stack_fffffffffffffedc);
    (**(code **)(*(long *)pQVar7 + 0x70))(pQVar7,&local_b0,local_b4);
    QItemSelection::~QItemSelection((QItemSelection *)0x8db9a4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setRangeSelected(const QTableWidgetSelectionRange &range, bool select)
{
    if (!model()->hasIndex(range.topRow(), range.leftColumn(), rootIndex()) ||
        !model()->hasIndex(range.bottomRow(), range.rightColumn(), rootIndex()))
        return;

    QModelIndex topLeft = model()->index(range.topRow(), range.leftColumn(), rootIndex());
    QModelIndex bottomRight = model()->index(range.bottomRow(), range.rightColumn(), rootIndex());

    selectionModel()->select(QItemSelection(topLeft, bottomRight),
                             select ? QItemSelectionModel::Select : QItemSelectionModel::Deselect);
}